

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  iterator keywords;
  iterator topN;
  difference_type dVar3;
  pointer ppVar4;
  ostream *v;
  Jieba *this;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  keywordres;
  size_t topk;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tagres;
  iterator it;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  LookupTagres;
  char DemoTokens [4] [32];
  int DemoTokenMaxLen;
  string result;
  string s;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> jiebawords;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  Jieba jieba;
  string *in_stack_fffffffffffff268;
  Jieba *in_stack_fffffffffffff270;
  Jieba *in_stack_fffffffffffff278;
  Jieba *in_stack_fffffffffffff280;
  ostream *in_stack_fffffffffffff288;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff290;
  string *in_stack_fffffffffffff298;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff2a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff2a8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2b0;
  char *pcVar5;
  string *in_stack_fffffffffffff2b8;
  string *in_stack_fffffffffffff2c0;
  string *in_stack_fffffffffffff2c8;
  string *in_stack_fffffffffffff2d0;
  string *in_stack_fffffffffffff2d8;
  Jieba *in_stack_fffffffffffff2e0;
  string local_bc8 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_ba8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_ba0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b98;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b90 [5];
  char local_b68 [136];
  undefined4 local_ae0;
  allocator<char> local_ad9;
  string local_ad8 [32];
  string *in_stack_fffffffffffff558;
  KeywordExtractor *in_stack_fffffffffffff560;
  allocator<char> local_a81;
  string local_a80 [39];
  allocator<char> local_a59;
  string local_a58 [39];
  allocator<char> local_a31;
  string local_a30 [39];
  allocator<char> local_a09;
  string local_a08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9e0;
  string local_9d8 [39];
  allocator<char> local_9b1;
  string local_9b0 [39];
  allocator<char> local_989;
  string local_988 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_960;
  string local_958 [39];
  allocator<char> local_931;
  string local_930 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_908;
  string local_900 [39];
  allocator<char> local_8d9;
  string local_8d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b0;
  string local_8a8 [39];
  allocator<char> local_881;
  string local_880 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_858;
  string local_850 [32];
  string local_830 [32];
  string local_810 [87];
  allocator<char> local_7b9;
  string local_7b8 [39];
  allocator<char> local_791;
  string local_790 [39];
  allocator<char> local_769;
  string local_768 [39];
  allocator<char> local_741;
  string local_740 [55];
  allocator<char> local_709;
  string local_708 [1796];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  cppjieba::Jieba::Jieba
            (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
             in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13c8a6);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x13c8b3);
  std::__cxx11::string::string(local_810);
  std::__cxx11::string::string(local_830);
  std::__cxx11::string::operator=(local_810,anon_var_dwarf_1d818);
  poVar2 = std::operator<<((ostream *)&std::cout,local_810);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] Cut With HMM");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cppjieba::Jieba::Cut
            (in_stack_fffffffffffff280,(string *)in_stack_fffffffffffff278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff270,SUB81((ulong)in_stack_fffffffffffff268 >> 0x38,0));
  local_858 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff268);
  local_860 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  poVar2 = std::operator<<((ostream *)&std::cout,local_850);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_850);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator(&local_881);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] Cut Without HMM ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cppjieba::Jieba::Cut
            (in_stack_fffffffffffff280,(string *)in_stack_fffffffffffff278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff270,SUB81((ulong)in_stack_fffffffffffff268 >> 0x38,0));
  local_8b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff268);
  local_8b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  poVar2 = std::operator<<((ostream *)&std::cout,local_8a8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_8a8);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::operator=(local_810,anon_var_dwarf_1d86e);
  poVar2 = std::operator<<((ostream *)&std::cout,local_810);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] CutAll");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cppjieba::Jieba::CutAll
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x13cc32);
  local_908 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff268);
  local_910 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  poVar2 = std::operator<<((ostream *)&std::cout,local_900);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_900);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator(&local_931);
  std::__cxx11::string::operator=(local_810,anon_var_dwarf_1d8a0);
  poVar2 = std::operator<<((ostream *)&std::cout,local_810);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] CutForSearch");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cppjieba::Jieba::CutForSearch
            (in_stack_fffffffffffff280,(string *)in_stack_fffffffffffff278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff270,SUB81((ulong)in_stack_fffffffffffff268 >> 0x38,0));
  local_960 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff268);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  poVar2 = std::operator<<((ostream *)&std::cout,local_958);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator(&local_989);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] Insert User Word");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  cppjieba::Jieba::Cut
            (in_stack_fffffffffffff280,(string *)in_stack_fffffffffffff278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff270,SUB81((ulong)in_stack_fffffffffffff268 >> 0x38,0));
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  local_9e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff268);
  local_9e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  poVar2 = std::operator<<((ostream *)&std::cout,local_9d8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  cppjieba::Jieba::InsertUserWord
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268,(string *)0x13d0b1);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator(&local_a59);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator(&local_a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  cppjieba::Jieba::Cut
            (in_stack_fffffffffffff280,(string *)in_stack_fffffffffffff278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff270,SUB81((ulong)in_stack_fffffffffffff268 >> 0x38,0));
  std::__cxx11::string::~string(local_a80);
  std::allocator<char>::~allocator(&local_a81);
  keywords = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff268);
  topN = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2b0,(char *)in_stack_fffffffffffff2a8._M_current,
             (allocator<char> *)in_stack_fffffffffffff2a0._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffff558);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff558);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator(&local_ad9);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] CutForSearch Word With Offset");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cppjieba::Jieba::CutForSearch
            (in_stack_fffffffffffff280,(string *)in_stack_fffffffffffff278,
             (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)in_stack_fffffffffffff270,
             SUB81((ulong)in_stack_fffffffffffff268 >> 0x38,0));
  poVar2 = std::operator<<(in_stack_fffffffffffff288,
                           (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
                           in_stack_fffffffffffff280);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] Lookup Tag for Single Token");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_ae0 = 0x20;
  local_b68[0x70] = '\0';
  local_b68[0x71] = '\0';
  local_b68[0x72] = '\0';
  local_b68[0x73] = '\0';
  local_b68[0x74] = '\0';
  local_b68[0x75] = '\0';
  local_b68[0x76] = '\0';
  local_b68[0x77] = '\0';
  local_b68[0x78] = '\0';
  local_b68[0x79] = '\0';
  local_b68[0x7a] = '\0';
  local_b68[0x7b] = '\0';
  local_b68[0x7c] = '\0';
  local_b68[0x7d] = '\0';
  local_b68[0x7e] = '\0';
  local_b68[0x7f] = '\0';
  builtin_strncpy(local_b68 + 0x60,"。",4);
  local_b68[100] = '\0';
  local_b68[0x65] = '\0';
  local_b68[0x66] = '\0';
  local_b68[0x67] = '\0';
  local_b68[0x68] = '\0';
  local_b68[0x69] = '\0';
  local_b68[0x6a] = '\0';
  local_b68[0x6b] = '\0';
  local_b68[0x6c] = '\0';
  local_b68[0x6d] = '\0';
  local_b68[0x6e] = '\0';
  local_b68[0x6f] = '\0';
  local_b68[0x50] = '\0';
  local_b68[0x51] = '\0';
  local_b68[0x52] = '\0';
  local_b68[0x53] = '\0';
  local_b68[0x54] = '\0';
  local_b68[0x55] = '\0';
  local_b68[0x56] = '\0';
  local_b68[0x57] = '\0';
  local_b68[0x58] = '\0';
  local_b68[0x59] = '\0';
  local_b68[0x5a] = '\0';
  local_b68[0x5b] = '\0';
  local_b68[0x5c] = '\0';
  local_b68[0x5d] = '\0';
  local_b68[0x5e] = '\0';
  local_b68[0x5f] = '\0';
  builtin_strncpy(local_b68 + 0x40,"123",4);
  local_b68[0x44] = '\0';
  local_b68[0x45] = '\0';
  local_b68[0x46] = '\0';
  local_b68[0x47] = '\0';
  local_b68[0x48] = '\0';
  local_b68[0x49] = '\0';
  local_b68[0x4a] = '\0';
  local_b68[0x4b] = '\0';
  local_b68[0x4c] = '\0';
  local_b68[0x4d] = '\0';
  local_b68[0x4e] = '\0';
  local_b68[0x4f] = '\0';
  local_b68[0x30] = '\0';
  local_b68[0x31] = '\0';
  local_b68[0x32] = '\0';
  local_b68[0x33] = '\0';
  local_b68[0x34] = '\0';
  local_b68[0x35] = '\0';
  local_b68[0x36] = '\0';
  local_b68[0x37] = '\0';
  local_b68[0x38] = '\0';
  local_b68[0x39] = '\0';
  local_b68[0x3a] = '\0';
  local_b68[0x3b] = '\0';
  local_b68[0x3c] = '\0';
  local_b68[0x3d] = '\0';
  local_b68[0x3e] = '\0';
  local_b68[0x3f] = '\0';
  builtin_strncpy(local_b68 + 0x20,"CEO",4);
  local_b68[0x24] = '\0';
  local_b68[0x25] = '\0';
  local_b68[0x26] = '\0';
  local_b68[0x27] = '\0';
  local_b68[0x28] = '\0';
  local_b68[0x29] = '\0';
  local_b68[0x2a] = '\0';
  local_b68[0x2b] = '\0';
  local_b68[0x2c] = '\0';
  local_b68[0x2d] = '\0';
  local_b68[0x2e] = '\0';
  local_b68[0x2f] = '\0';
  local_b68[0x10] = '\0';
  local_b68[0x11] = '\0';
  local_b68[0x12] = '\0';
  local_b68[0x13] = '\0';
  local_b68[0x14] = '\0';
  local_b68[0x15] = '\0';
  local_b68[0x16] = '\0';
  local_b68[0x17] = '\0';
  local_b68[0x18] = '\0';
  local_b68[0x19] = '\0';
  local_b68[0x1a] = '\0';
  local_b68[0x1b] = '\0';
  local_b68[0x1c] = '\0';
  local_b68[0x1d] = '\0';
  local_b68[0x1e] = '\0';
  local_b68[0x1f] = '\0';
  builtin_strncpy(local_b68,"拖拉机",10);
  local_b68[10] = '\0';
  local_b68[0xb] = '\0';
  local_b68[0xc] = '\0';
  local_b68[0xd] = '\0';
  local_b68[0xe] = '\0';
  local_b68[0xf] = '\0';
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x13d374);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(in_stack_fffffffffffff290,(size_type)in_stack_fffffffffffff288,
           (allocator_type *)in_stack_fffffffffffff280);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x13d39a);
  __gnu_cxx::
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::__normal_iterator(local_b90);
  local_b98 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff268);
  local_b90[0]._M_current = local_b98;
  while( true ) {
    local_ba0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff268);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff270,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff268);
    if (!bVar1) break;
    local_ba8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff268);
    this_00 = local_b90;
    dVar3 = __gnu_cxx::operator-
                      ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff270,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff268);
    pcVar5 = local_b68 + dVar3 * 0x20;
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(this_00);
    std::__cxx11::string::operator=((string *)ppVar4,pcVar5);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator->(local_b90);
    cppjieba::Jieba::LookupTag(in_stack_fffffffffffff278,(string *)in_stack_fffffffffffff270);
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(local_b90);
    std::__cxx11::string::operator=((string *)&ppVar4->second,local_bc8);
    std::__cxx11::string::~string(local_bc8);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff278,(int)((ulong)in_stack_fffffffffffff270 >> 0x20));
  }
  poVar2 = std::operator<<(in_stack_fffffffffffff288,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff280);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[demo] Tagging");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x13da2e);
  std::__cxx11::string::operator=(local_810,anon_var_dwarf_1d94c);
  cppjieba::Jieba::Tag
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x13da61);
  poVar2 = std::operator<<((ostream *)&std::cout,local_810);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_stack_fffffffffffff288,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff280);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  v = std::operator<<((ostream *)&std::cout,"[demo] Keyword Extraction");
  std::ostream::operator<<(v,std::endl<char,std::char_traits<char>>);
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  vector((vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
          *)0x13db0a);
  cppjieba::KeywordExtractor::Extract
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558,
             (vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
              *)keywords._M_current,(size_t)topN._M_current);
  this = (Jieba *)std::operator<<((ostream *)&std::cout,local_810);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                   *)v);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  ~vector((vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
           *)v);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)v);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)v);
  std::__cxx11::string::~string(local_830);
  std::__cxx11::string::~string(local_810);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)v);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)v);
  cppjieba::Jieba::~Jieba(this);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  cppjieba::Jieba jieba(DICT_PATH,
        HMM_PATH,
        USER_DICT_PATH,
        IDF_PATH,
        STOP_WORD_PATH);
  vector<string> words;
  vector<cppjieba::Word> jiebawords;
  string s;
  string result;

  s = "他来到了网易杭研大厦";
  cout << s << endl;
  cout << "[demo] Cut With HMM" << endl;
  jieba.Cut(s, words, true);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] Cut Without HMM " << endl;
  jieba.Cut(s, words, false);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  s = "我来到北京清华大学";
  cout << s << endl;
  cout << "[demo] CutAll" << endl;
  jieba.CutAll(s, words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  s = "小明硕士毕业于中国科学院计算所，后在日本京都大学深造";
  cout << s << endl;
  cout << "[demo] CutForSearch" << endl;
  jieba.CutForSearch(s, words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] Insert User Word" << endl;
  jieba.Cut("男默女泪", words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;
  jieba.InsertUserWord("男默女泪");
  jieba.Cut("男默女泪", words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] CutForSearch Word With Offset" << endl;
  jieba.CutForSearch(s, jiebawords, true);
  cout << jiebawords << endl;

  cout << "[demo] Lookup Tag for Single Token" << endl;
  const int DemoTokenMaxLen = 32;
  char DemoTokens[][DemoTokenMaxLen] = {"拖拉机", "CEO", "123", "。"};
  vector<pair<string, string> > LookupTagres(sizeof(DemoTokens) / DemoTokenMaxLen);
  vector<pair<string, string> >::iterator it;
  for (it = LookupTagres.begin(); it != LookupTagres.end(); it++) {
	it->first = DemoTokens[it - LookupTagres.begin()];
	it->second = jieba.LookupTag(it->first);
  }
  cout << LookupTagres << endl;

  cout << "[demo] Tagging" << endl;
  vector<pair<string, string> > tagres;
  s = "我是拖拉机学院手扶拖拉机专业的。不用多久，我就会升职加薪，当上CEO，走上人生巅峰。";
  jieba.Tag(s, tagres);
  cout << s << endl;
  cout << tagres << endl;

  cout << "[demo] Keyword Extraction" << endl;
  const size_t topk = 5;
  vector<cppjieba::KeywordExtractor::Word> keywordres;
  jieba.extractor.Extract(s, keywordres, topk);
  cout << s << endl;
  cout << keywordres << endl;
  return EXIT_SUCCESS;
}